

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O2

void __thiscall
prometheus::Exposer::Exposer
          (Exposer *this,string *bind_address,size_t num_threads,CivetCallbacks *callbacks)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_c3;
  allocator local_c2;
  allocator local_c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [32];
  string local_68 [32];
  string local_48;
  
  std::__cxx11::string::string((string *)&local_a8,"listening_ports",&local_c1);
  std::__cxx11::string::string(local_88,(string *)bind_address);
  std::__cxx11::string::string(local_68,"num_threads",&local_c2);
  std::__cxx11::to_string(&local_48,num_threads);
  __l._M_len = 4;
  __l._M_array = &local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l,&local_c3);
  Exposer(this,&local_c0,callbacks);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_a8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

Exposer::Exposer(const std::string& bind_address, const std::size_t num_threads,
                 const CivetCallbacks* callbacks)
    : Exposer(
          std::vector<std::string>{"listening_ports", bind_address,
                                   "num_threads", std::to_string(num_threads)},
          callbacks) {}